

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O1

void __thiscall Nes_Vrc6_Apu::run_square(Nes_Vrc6_Apu *this,Vrc6_Osc *osc,blip_time_t end_time)

{
  byte bVar1;
  byte bVar2;
  blip_time_t t;
  Blip_Buffer *buf;
  int iVar3;
  uint uVar4;
  uint delta;
  uint uVar5;
  int iVar6;
  
  buf = osc->output;
  if (buf != (Blip_Buffer *)0x0) {
    buf->modified_ = 1;
    bVar1 = osc->regs[0];
    delta = bVar1 & 0xf;
    if (-1 < (char)osc->regs[2]) {
      delta = 0;
    }
    uVar4 = bVar1 >> 4 & 7;
    uVar5 = 0;
    if (osc->phase <= (int)uVar4) {
      uVar5 = delta;
    }
    if ((char)bVar1 < '\0') {
      uVar5 = delta;
    }
    t = this->last_time;
    iVar3 = uVar5 - osc->last_amp;
    if (iVar3 != 0) {
      osc->last_amp = uVar5;
      Blip_Synth<12,_1>::offset(&this->square_synth,t,iVar3,buf);
    }
    iVar3 = t + osc->delay;
    bVar2 = osc->regs[2];
    osc->delay = 0;
    if (((-1 < (char)bVar1) && (delta != 0)) &&
       (uVar5 = (uint)osc->regs[1] + (bVar2 & 0xf) * 0x100 + 1, 4 < uVar5)) {
      if (iVar3 < end_time) {
        iVar6 = osc->phase;
        do {
          iVar6 = iVar6 + 1;
          if (iVar6 == 0x10) {
            osc->last_amp = delta;
            Blip_Synth<12,_1>::offset(&this->square_synth,iVar3,delta,buf);
            iVar6 = 0;
          }
          if (iVar6 == uVar4 + 1) {
            osc->last_amp = 0;
            Blip_Synth<12,_1>::offset(&this->square_synth,iVar3,-delta,buf);
          }
          iVar3 = iVar3 + uVar5;
        } while (iVar3 < end_time);
        osc->phase = iVar6;
      }
      osc->delay = iVar3 - end_time;
    }
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::run_square( Vrc6_Osc& osc, blip_time_t end_time )
{
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	output->set_modified();
	
	int volume = osc.regs [0] & 15;
	if ( !(osc.regs [2] & 0x80) )
		volume = 0;
	
	int gate = osc.regs [0] & 0x80;
	int duty = ((osc.regs [0] >> 4) & 7) + 1;
	int delta = ((gate || osc.phase < duty) ? volume : 0) - osc.last_amp;
	blip_time_t time = last_time;
	if ( delta )
	{
		osc.last_amp += delta;
		square_synth.offset( time, delta, output );
	}
	
	time += osc.delay;
	osc.delay = 0;
	int period = osc.period();
	if ( volume && !gate && period > 4 )
	{
		if ( time < end_time )
		{
			int phase = osc.phase;
			
			do
			{
				phase++;
				if ( phase == 16 )
				{
					phase = 0;
					osc.last_amp = volume;
					square_synth.offset( time, volume, output );
				}
				if ( phase == duty )
				{
					osc.last_amp = 0;
					square_synth.offset( time, -volume, output );
				}
				time += period;
			}
			while ( time < end_time );
			
			osc.phase = phase;
		}
		osc.delay = time - end_time;
	}
}